

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O1

type __thiscall
itlib::
flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
::operator[]<char_const(&)[13]>
          (flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           *this,char (*k) [13])

{
  int iVar1;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  __position;
  Variant VStack_48;
  
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,Rml::Variant>*,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>,char[13],__gnu_cxx::__ops::_Iter_comp_val<itlib::fmimpl::pair_compare<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less>>>
                         (*(undefined8 *)this,*(undefined8 *)(this + 8),k);
  if (__position._M_current !=
      *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        **)(this + 8)) {
    iVar1 = std::__cxx11::string::compare((char *)__position._M_current);
    if (iVar1 < 1) goto LAB_001ebd73;
  }
  Rml::Variant::Variant(&VStack_48);
  __position._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)std::
          vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>
          ::_M_emplace_aux<char_const(&)[13],Rml::Variant>
                    ((vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>
                      *)this,__position._M_current,k,&VStack_48);
  Rml::Variant::~Variant(&VStack_48);
LAB_001ebd73:
  return &(__position._M_current)->second;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }